

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99SeedAdj(stb99_seed *seed)

{
  size_t r_00;
  bool_t bVar1;
  err_t eVar2;
  ulong uVar3;
  stb99_seed *in_RDI;
  size_t r;
  size_t i;
  ulong local_18;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x128);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    for (local_18 = 0; (local_18 < 10 && (_ls[local_18] != in_RDI->l)); local_18 = local_18 + 1) {
    }
    if (local_18 == 10) {
      local_4 = 0x20c;
    }
    else {
      r_00 = _rs[local_18];
      eVar2 = stb99ZiVal(in_RDI);
      if (eVar2 != 0) {
        bVar1 = memIsZero(in_RDI->zi,0x3e);
        if (bVar1 == 0) {
          return 0x20c;
        }
        for (local_18 = 0; local_18 < 0x1f; local_18 = local_18 + 1) {
          in_RDI->zi[local_18] = (short)local_18 + 1;
        }
      }
      eVar2 = stb99DiVal(in_RDI,r_00);
      if (eVar2 != 0) {
        bVar1 = memIsZero(in_RDI->di,0x90);
        if (bVar1 == 0) {
          return 0x20c;
        }
        in_RDI->di[0] = (in_RDI->l >> 1) + 1;
        local_18 = 1;
        while (uVar3 = (in_RDI->di[local_18 + -1] >> 1) + 1, in_RDI->di[local_18] = uVar3,
              0x20 < uVar3) {
          local_18 = local_18 + 1;
        }
      }
      eVar2 = stb99RiVal(in_RDI,r_00);
      if (eVar2 != 0) {
        bVar1 = memIsZero(in_RDI->ri,0x50);
        if (bVar1 == 0) {
          return 0x20c;
        }
        in_RDI->ri[0] = r_00;
        local_18 = 1;
        while (uVar3 = (in_RDI->ri[local_18 + -1] >> 1) + 1, in_RDI->ri[local_18] = uVar3,
              0x20 < uVar3) {
          local_18 = local_18 + 1;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

err_t stb99SeedAdj(stb99_seed* seed)
{
	size_t i;
	size_t r;
	// проверить указатели
	if (!memIsValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// проверить l
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == seed->l)
			break;
	if (i == COUNT_OF(_ls))
		return ERR_BAD_SEED;
	// определить r = r(l)
	r = _rs[i];
	// проверить zi
	if (stb99ZiVal(seed) != ERR_OK)
	{
		if (!memIsZero(seed->zi, sizeof(seed->zi)))
			return ERR_BAD_SEED;
		for (i = 0; i < 31; ++i)
			seed->zi[i] = (u16)(i + 1);
	}
	// проверить цепочку di
	if (stb99DiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->di, sizeof(seed->di)))
			return ERR_BAD_SEED;
		seed->di[0] = seed->l / 2 + 1;
		for (i = 1; (seed->di[i] = seed->di[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->di[i] > 16);
	}
	// проверить цепочку ri
	if (stb99RiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->ri, sizeof(seed->ri)))
			return ERR_BAD_SEED;
		seed->ri[0] = r;
		for (i = 1; (seed->ri[i] = seed->ri[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->ri[i] > 16);
	}
	return ERR_OK;
}